

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# only.cpp
# Opt level: O2

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_9(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  bool local_ed;
  ExpressionDecomposer local_ec;
  Result local_e8;
  type t;
  tail_type *local_b0;
  Enum local_a8;
  ResultBuilder DOCTEST_RB;
  
  t.super_type.head = 0x2a;
  t.super_type.tail.head = 3.14;
  t.super_type.tail.tail.head = true;
  doctest::String::String((String *)&local_e8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/view.cpp"
             ,0x35,"std::get<1>(l) == true","",(String *)&local_e8);
  doctest::String::~String((String *)&local_e8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_ec,DT_CHECK);
  local_b0 = &t.super_type.tail.tail;
  local_a8 = local_ec.m_at;
  local_ed = true;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (&local_e8,(Expression_lhs<bool_const&> *)&local_b0,&local_ed);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  return;
}

Assistant:

auto operator () (T t) const
        {
            ++calls;
            return t * t;
        }